

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>::Initialize
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>
           *this)

{
  TPZDohrAssembly<std::complex<double>_> *pTVar1;
  TPZVec<int> *pTVar2;
  long lVar3;
  int *piVar4;
  TPZSkylMatrix<std::complex<double>_> *this_00;
  TPZStepSolver<std::complex<double>_> *this_01;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  _List_node_base *p_Var10;
  TPZManVector<long,_10> skyline;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_a0;
  TPZManVector<long,_10> local_98;
  
  TPZManVector<long,_10>::TPZManVector(&local_98,this->fNumCoarse);
  if (0 < this->fNumCoarse) {
    lVar5 = 0;
    do {
      local_98.super_TPZVec<long>.fStore[lVar5] = lVar5;
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->fNumCoarse);
  }
  pTVar1 = ((this->fAssemble).fRef)->fPointer;
  lVar5 = (pTVar1->fCoarseEqs).fNElements;
  if (0 < lVar5) {
    pTVar2 = (pTVar1->fCoarseEqs).fStore;
    lVar6 = 0;
    do {
      lVar3 = pTVar2[lVar6].fNElements;
      if ((lVar3 != 0) && (0 < lVar3)) {
        lVar9 = 0;
        lVar8 = (long)*pTVar2[lVar6].fStore;
        do {
          lVar7 = (long)pTVar2[lVar6].fStore[lVar9];
          if (lVar8 < lVar7) {
            lVar7 = lVar8;
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar7;
        } while (lVar3 != lVar9);
        if (0 < lVar3) {
          piVar4 = pTVar2[lVar6].fStore;
          lVar8 = 0;
          do {
            if (lVar7 < local_98.super_TPZVec<long>.fStore[piVar4[lVar8]]) {
              local_98.super_TPZVec<long>.fStore[piVar4[lVar8]] = lVar7;
            }
            lVar8 = lVar8 + 1;
          } while (lVar3 != lVar8);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  this_00 = (TPZSkylMatrix<std::complex<double>_> *)operator_new(0x60);
  TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix
            (this_00,this->fNumCoarse,&local_98.super_TPZVec<long>);
  p_Var10 = (this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)&this->fGlobal) {
    lVar5 = 0;
    do {
      TPZDohrSubstructCondense<std::complex<double>_>::Contribute_Kc
                ((TPZDohrSubstructCondense<std::complex<double>_> *)(p_Var10[1]._M_next)->_M_next,
                 (TPZMatrix<std::complex<double>_> *)this_00,
                 (TPZVec<int> *)
                 ((long)&((((this->fAssemble).fRef)->fPointer->fCoarseEqs).fStore)->_vptr_TPZVec +
                 lVar5));
      p_Var10 = p_Var10->_M_next;
      lVar5 = lVar5 + 0x20;
    } while (p_Var10 != (_List_node_base *)&this->fGlobal);
  }
  this_01 = (TPZStepSolver<std::complex<double>_> *)operator_new(0x100);
  local_a0.fRef = (TPZReference *)operator_new(0x10);
  ((local_a0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_a0.fRef)->fPointer = (TPZMatrix<std::complex<double>_> *)this_00;
  LOCK();
  ((local_a0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<std::complex<double>_>::TPZStepSolver(this_01,&local_a0);
  this->fCoarse = this_01;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_a0);
  TPZManVector<long,_10>::~TPZManVector(&local_98);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Initialize()
{
	//Compute the skyline of the coarse equations
	TPZManVector<int64_t> skyline(fNumCoarse);
	int64_t ic;
	for (ic=0; ic<fNumCoarse; ic++) {
		skyline[ic] = ic;
	}
	int64_t nsub = fAssemble->fCoarseEqs.NElements();
	int64_t isub;
	for (isub=0; isub<nsub; isub++) {
		int64_t nc = fAssemble->fCoarseEqs[isub].NElements();
		int64_t ic;
		int64_t mineq = 0;
        if(nc != 0) mineq = fAssemble->fCoarseEqs[isub][0];
		for (ic=0; ic<nc; ic++) {
			int64_t eq = fAssemble->fCoarseEqs[isub][ic];
			mineq = mineq > eq ? eq : mineq;
		}
		for (ic=0; ic<nc; ic++) {
			int64_t eq = fAssemble->fCoarseEqs[isub][ic];
			if(skyline[eq] > mineq) skyline[eq] = mineq;
		}
	}
	/* Computing K(c) */
	TPZMatrix<TVar> *coarse = new TPZSkylMatrix<TVar>(fNumCoarse,skyline);
#ifdef PZDEBUG
	{
		TPZFMatrix<TVar> coarse2(*coarse);
		for (isub=0; isub<nsub; isub++) {
			int64_t nc = fAssemble->fCoarseEqs[isub].NElements();
			int64_t ic;
			for (ic=0; ic<nc; ic++) {
				int64_t ieq = fAssemble->fCoarseEqs[isub][ic];
				int64_t jc;
				for (jc=0; jc<nc; jc++) {
					int64_t jeq = fAssemble->fCoarseEqs[isub][jc];
					coarse2(ieq,jeq) = 1.;
				}
			}
			
		}
		VisualMatrix(coarse2,"CoarseMatrix.vtk");
	}
#endif
	typename std::list<TPZAutoPointer<TSubStruct> >::iterator it;
	int count = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,count++)
	{
		(*it)->Contribute_Kc(*coarse,fAssemble->fCoarseEqs[count]);
	}
	fCoarse = new TPZStepSolver<TVar>(coarse);
}